

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O3

int run_test_barrier_1(void)

{
  int iVar1;
  undefined8 *puVar2;
  uv_thread_t thread;
  worker_config wc;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  uint uStack_10;
  uint uStack_c;
  
  puVar2 = &local_38;
  local_18 = 0;
  uStack_10 = 0;
  uStack_c = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  iVar1 = uv_barrier_init(puVar2,2);
  if (iVar1 == 0) {
    puVar2 = &local_40;
    iVar1 = uv_thread_create(puVar2,worker,&local_38);
    if (iVar1 != 0) goto LAB_0014c529;
    uv_sleep(100);
    uStack_10 = uv_barrier_wait(&local_38);
    puVar2 = &local_40;
    iVar1 = uv_thread_join();
    if (iVar1 == 0) {
      puVar2 = &local_38;
      uv_barrier_destroy();
      if ((uStack_c ^ uStack_10) == 1) {
        return 0;
      }
      goto LAB_0014c533;
    }
  }
  else {
    run_test_barrier_1_cold_1();
LAB_0014c529:
    run_test_barrier_1_cold_2();
  }
  run_test_barrier_1_cold_3();
LAB_0014c533:
  run_test_barrier_1_cold_4();
  if (*(int *)(puVar2 + 4) != 0) {
    uv_sleep();
  }
  iVar1 = uv_barrier_wait(puVar2);
  *(int *)((long)puVar2 + 0x2c) = iVar1;
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_1) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));

  ASSERT(0 == uv_barrier_init(&wc.barrier, 2));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sleep(100);
  wc.main_barrier_wait_rval = uv_barrier_wait(&wc.barrier);

  ASSERT(0 == uv_thread_join(&thread));
  uv_barrier_destroy(&wc.barrier);

  ASSERT(1 == (wc.main_barrier_wait_rval ^ wc.worker_barrier_wait_rval));

  return 0;
}